

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

int dwarf_dnames_bucket(Dwarf_Dnames_Head dn,Dwarf_Unsigned bucket_number,Dwarf_Unsigned *name_index
                       ,Dwarf_Unsigned *collision_count,Dwarf_Error *error)

{
  Dwarf_DN_Bucket_s *pDVar1;
  int iVar2;
  int res;
  Dwarf_DN_Bucket_s *cur;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *collision_count_local;
  Dwarf_Unsigned *name_index_local;
  Dwarf_Unsigned bucket_number_local;
  Dwarf_Dnames_Head dn_local;
  
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: bad Head argument to dwarf_dnames_bucket");
    dn_local._4_4_ = 1;
  }
  else if (bucket_number < dn->dn_bucket_count) {
    iVar2 = _dwarf_initialize_bucket_details(dn,error);
    if (iVar2 == 1) {
      dn_local._4_4_ = 1;
    }
    else if (dn->dn_bucket_array == (Dwarf_DN_Bucket_s *)0x0) {
      dn_local._4_4_ = -1;
    }
    else {
      pDVar1 = dn->dn_bucket_array;
      *name_index = pDVar1[bucket_number].db_nameindex;
      *collision_count = pDVar1[bucket_number].db_collisioncount;
      dn_local._4_4_ = 0;
    }
  }
  else {
    dn_local._4_4_ = -1;
  }
  return dn_local._4_4_;
}

Assistant:

int
dwarf_dnames_bucket(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      bucket_number,
    Dwarf_Unsigned    * name_index,
    Dwarf_Unsigned    * collision_count,
    Dwarf_Error *       error)
{
    struct Dwarf_DN_Bucket_s *cur = 0;
    int res = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: bad Head argument to "
            "dwarf_dnames_bucket");
        return DW_DLV_ERROR;
    }
    if (bucket_number >= dn->dn_bucket_count) {
        return DW_DLV_NO_ENTRY;
    }
    res  = _dwarf_initialize_bucket_details(dn,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (!dn->dn_bucket_array) {
        return DW_DLV_NO_ENTRY;
    }
    cur = dn->dn_bucket_array + bucket_number;
    *name_index = cur->db_nameindex;
    *collision_count = cur->db_collisioncount;
    return DW_DLV_OK;
}